

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpki.c
# Opt level: O3

size_t bpkiEdataDec(octet *edata,size_t *edata_len,octet *salt,size_t *iter,octet *epki,size_t count
                   )

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  octet *poVar5;
  size_t sVar6;
  octet *poVar7;
  der_anchor_t BeltKwpAlgId [1];
  der_anchor_t PrfAlgId [1];
  der_anchor_t PBKDF2_params [1];
  der_anchor_t PBKDF2AlgId [1];
  der_anchor_t PBES2_params [1];
  der_anchor_t EncryptionAlgId [1];
  der_anchor_t EPKI [1];
  der_anchor_t local_118;
  der_anchor_t local_f8;
  der_anchor_t local_d8;
  der_anchor_t local_b8;
  der_anchor_t local_98;
  der_anchor_t local_78;
  der_anchor_t local_58;
  
  sVar1 = derTSEQDecStart(&local_58,epki,count,0x30);
  poVar5 = (octet *)0xffffffffffffffff;
  if (sVar1 != 0xffffffffffffffff) {
    poVar7 = epki + sVar1;
    sVar2 = derTSEQDecStart(&local_78,poVar7,count - sVar1,0x30);
    if (sVar2 != 0xffffffffffffffff) {
      sVar6 = (count - sVar1) - sVar2;
      poVar7 = poVar7 + sVar2;
      sVar1 = derOIDDec2(poVar7,sVar6,"1.2.840.113549.1.5.13");
      if (sVar1 != 0xffffffffffffffff) {
        sVar6 = sVar6 - sVar1;
        poVar7 = poVar7 + sVar1;
        sVar1 = derTSEQDecStart(&local_98,poVar7,sVar6,0x30);
        if (sVar1 != 0xffffffffffffffff) {
          sVar6 = sVar6 - sVar1;
          poVar7 = poVar7 + sVar1;
          sVar1 = derTSEQDecStart(&local_b8,poVar7,sVar6,0x30);
          if (sVar1 != 0xffffffffffffffff) {
            sVar6 = sVar6 - sVar1;
            poVar7 = poVar7 + sVar1;
            sVar1 = derOIDDec2(poVar7,sVar6,"1.2.840.113549.1.5.12");
            if (sVar1 != 0xffffffffffffffff) {
              sVar6 = sVar6 - sVar1;
              poVar7 = poVar7 + sVar1;
              sVar1 = derTSEQDecStart(&local_d8,poVar7,sVar6,0x30);
              if (sVar1 != 0xffffffffffffffff) {
                sVar6 = sVar6 - sVar1;
                poVar7 = poVar7 + sVar1;
                sVar1 = derTOCTDec2(salt,poVar7,sVar6,4,8);
                if (sVar1 != 0xffffffffffffffff) {
                  sVar6 = sVar6 - sVar1;
                  poVar7 = poVar7 + sVar1;
                  sVar1 = derTSIZEDec(iter,poVar7,sVar6,2);
                  if (sVar1 != 0xffffffffffffffff) {
                    sVar6 = sVar6 - sVar1;
                    poVar7 = poVar7 + sVar1;
                    sVar1 = derTSEQDecStart(&local_f8,poVar7,sVar6,0x30);
                    if (sVar1 != 0xffffffffffffffff) {
                      sVar6 = sVar6 - sVar1;
                      poVar7 = poVar7 + sVar1;
                      sVar1 = derOIDDec2(poVar7,sVar6,"1.2.112.0.2.0.34.101.47.12");
                      if (sVar1 != 0xffffffffffffffff) {
                        sVar6 = sVar6 - sVar1;
                        poVar7 = poVar7 + sVar1;
                        sVar1 = derDec4(poVar7,sVar6,5,(void *)0x0,0);
                        if (sVar1 != 0xffffffffffffffff) {
                          poVar7 = poVar7 + sVar1;
                          sVar2 = derTSEQDecStop(poVar7,&local_f8);
                          if (sVar2 != 0xffffffffffffffff) {
                            poVar7 = poVar7 + sVar2;
                            sVar3 = derTSEQDecStop(poVar7,&local_d8);
                            if (sVar3 != 0xffffffffffffffff) {
                              poVar7 = poVar7 + sVar3;
                              sVar4 = derTSEQDecStop(poVar7,&local_b8);
                              if (sVar4 != 0xffffffffffffffff) {
                                sVar6 = sVar6 - (sVar1 + sVar2 + sVar3 + sVar4);
                                poVar7 = poVar7 + sVar4;
                                sVar1 = derTSEQDecStart(&local_118,poVar7,sVar6,0x30);
                                if (sVar1 != 0xffffffffffffffff) {
                                  sVar6 = sVar6 - sVar1;
                                  poVar7 = poVar7 + sVar1;
                                  sVar1 = derOIDDec2(poVar7,sVar6,"1.2.112.0.2.0.34.101.31.73");
                                  if (sVar1 != 0xffffffffffffffff) {
                                    sVar6 = sVar6 - sVar1;
                                    poVar7 = poVar7 + sVar1;
                                    sVar1 = derDec4(poVar7,sVar6,5,(void *)0x0,0);
                                    if (sVar1 != 0xffffffffffffffff) {
                                      poVar7 = poVar7 + sVar1;
                                      sVar2 = derTSEQDecStop(poVar7,&local_118);
                                      if (sVar2 != 0xffffffffffffffff) {
                                        poVar7 = poVar7 + sVar2;
                                        sVar3 = derTSEQDecStop(poVar7,&local_98);
                                        if (sVar3 != 0xffffffffffffffff) {
                                          poVar7 = poVar7 + sVar3;
                                          sVar4 = derTSEQDecStop(poVar7,&local_78);
                                          if (sVar4 != 0xffffffffffffffff) {
                                            poVar7 = poVar7 + sVar4;
                                            sVar1 = derTOCTDec(edata,edata_len,poVar7,
                                                               sVar6 - (sVar1 + sVar2 + sVar3 +
                                                                       sVar4),4);
                                            if (sVar1 != 0xffffffffffffffff) {
                                              sVar2 = derTSEQDecStop(poVar7 + sVar1,&local_58);
                                              if (sVar2 != 0xffffffffffffffff) {
                                                poVar5 = poVar7 + sVar1 + (sVar2 - (long)epki);
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (size_t)poVar5;
}

Assistant:

static size_t bpkiEdataDec(octet edata[], size_t* edata_len, octet salt[8],
	size_t* iter, const octet epki[], size_t count)
{
	der_anchor_t EPKI[1];
	der_anchor_t EncryptionAlgId[1];
	der_anchor_t PBES2_params[1];
	der_anchor_t PBKDF2AlgId[1];
	der_anchor_t PBKDF2_params[1];
	der_anchor_t PrfAlgId[1];
	der_anchor_t BeltKwpAlgId[1];
	const octet* ptr = epki;
	// декодировать
	derDecStep(derSEQDecStart(EPKI, ptr, count), ptr, count);
	 derDecStep(derSEQDecStart(EncryptionAlgId, ptr, count), ptr, count);
	  derDecStep(derOIDDec2(ptr, count, oid_id_pbes2), ptr, count);
	  derDecStep(derSEQDecStart(PBES2_params, ptr, count), ptr, count);
	   derDecStep(derSEQDecStart(PBKDF2AlgId, ptr, count), ptr, count);
	    derDecStep(derOIDDec2(ptr, count, oid_id_pbkdf2), ptr, count);
	    derDecStep(derSEQDecStart(PBKDF2_params, ptr, count), ptr, count);
	     derDecStep(derOCTDec2(salt, ptr, count, 8), ptr, count);
	     derDecStep(derSIZEDec(iter, ptr, count), ptr, count);
	     derDecStep(derSEQDecStart(PrfAlgId, ptr, count), ptr, count);
	      derDecStep(derOIDDec2(ptr, count, oid_hmac_hbelt), ptr, count);
	      derDecStep(derNULLDec(ptr, count), ptr, count);
	     derDecStep(derSEQDecStop(ptr, PrfAlgId), ptr, count);
	    derDecStep(derSEQDecStop(ptr, PBKDF2_params), ptr, count);
	   derDecStep(derSEQDecStop(ptr, PBKDF2AlgId), ptr, count);
	   derDecStep(derSEQDecStart(BeltKwpAlgId, ptr, count), ptr, count);
	    derDecStep(derOIDDec2(ptr, count, oid_belt_kwp256), ptr, count);
	    derDecStep(derNULLDec(ptr, count), ptr, count);
	   derDecStep(derSEQDecStop(ptr, BeltKwpAlgId), ptr, count);
	  derDecStep(derSEQDecStop(ptr, PBES2_params), ptr, count);
	 derDecStep(derSEQDecStop(ptr, EncryptionAlgId), ptr, count);
	 derDecStep(derOCTDec(edata, edata_len, ptr, count), ptr, count);
	derDecStep(derSEQDecStop(ptr, EPKI), ptr, count);
	// возвратить длину DER-кода
	return ptr - epki;
}